

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sl_serial.c
# Opt level: O3

slReturn autoBaudRate(int fdPort,int minBaud,baudRateSynchronizer *synchronizer,int verbosity)

{
  uint baud;
  errInfo error;
  _Bool _Var1;
  slReturn pvVar2;
  longlong lVar3;
  void *pvVar4;
  char *pcVar5;
  long lVar6;
  speedInfo si;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  speedInfo local_bc;
  errorInfo_slReturn local_b0;
  errorInfo_slReturn local_90;
  errorInfo_slReturn local_70;
  errorInfo_slReturn local_50;
  
  pvVar2 = getSpeedInfo(fdPort,&local_bc);
  _Var1 = isErrorReturn(pvVar2);
  if (_Var1) {
    createErrorInfo(&local_50,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                    ,"autoBaudRate",0x12d,pvVar2);
    uVar11 = SUB84(local_50.functionName,0);
    uVar12 = (undefined4)((ulong)local_50.functionName >> 0x20);
    uVar13 = local_50.lineNumber;
    uVar14 = local_50._28_4_;
    uVar7 = SUB84(local_50.cause,0);
    uVar8 = (undefined4)((ulong)local_50.cause >> 0x20);
    uVar9 = SUB84(local_50.fileName,0);
    uVar10 = (undefined4)((ulong)local_50.fileName >> 0x20);
    pcVar5 = "problem getting speed information";
LAB_0010a525:
    error.cause._4_4_ = uVar8;
    error.cause._0_4_ = uVar7;
    error.fileName._0_4_ = uVar9;
    error.fileName._4_4_ = uVar10;
    error.functionName._0_4_ = uVar11;
    error.functionName._4_4_ = uVar12;
    error.lineNumber = uVar13;
    error._28_4_ = uVar14;
    pvVar2 = makeErrorMsgReturn(error,pcVar5);
  }
  else {
    lVar3 = max_ll(4000,(long)(local_bc.nsChar / 4000));
    if (2 < verbosity) {
      printf("Trying baud rates from 921600 to %d...\n",(ulong)(uint)minBaud);
    }
    lVar6 = 0;
    do {
      baud = *(uint *)((long)&DAT_00115af0 + lVar6);
      if ((int)baud < minBaud) break;
      if (1 < verbosity) {
        printf("Trying %d baud...\n",(ulong)baud);
      }
      pvVar2 = setTermOptionsBaud(fdPort,baud);
      _Var1 = isErrorReturn(pvVar2);
      if (_Var1) {
        createErrorInfo(&local_70,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                        ,"autoBaudRate",0x13c,pvVar2);
        pcVar5 = "problem trying to set baud rate to %d";
        goto LAB_0010a680;
      }
      pvVar2 = (*synchronizer)(fdPort,(int)lVar3,verbosity);
      _Var1 = isErrorReturn(pvVar2);
      if (_Var1) {
        createErrorInfo(&local_90,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                        ,"autoBaudRate",0x141,pvVar2);
        uVar11 = SUB84(local_90.functionName,0);
        uVar12 = (undefined4)((ulong)local_90.functionName >> 0x20);
        uVar13 = local_90.lineNumber;
        uVar14 = local_90._28_4_;
        uVar7 = SUB84(local_90.cause,0);
        uVar8 = (undefined4)((ulong)local_90.cause >> 0x20);
        uVar9 = SUB84(local_90.fileName,0);
        uVar10 = (undefined4)((ulong)local_90.fileName >> 0x20);
        pcVar5 = "problem while synchronizing";
        goto LAB_0010a525;
      }
      pvVar4 = getReturnInfo(pvVar2);
      if (pvVar4 != (void *)0x0) {
        if (1 < verbosity) {
          printf("Synchronized on %d baud...\n",(ulong)baud);
        }
        pvVar2 = makeOkInfoReturn((void *)(long)(int)baud);
        return pvVar2;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x50);
    puts("Could not synchronize on any baud rate...");
    createErrorInfo(&local_b0,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                    ,"autoBaudRate",0x148,(slReturn)0x0);
    pcVar5 = "could not synchronize at any baud rate from 921600 to %d";
    baud = minBaud;
LAB_0010a680:
    pvVar2 = makeErrorFmtMsgReturn(pcVar5,(char *)(ulong)baud);
  }
  return pvVar2;
}

Assistant:

extern slReturn autoBaudRate( int fdPort, int minBaud, baudRateSynchronizer synchronizer, int verbosity ) {

    // we're going to allow 250 character times, or 4 seconds, whichever is greater...
    speedInfo si;
    // this code block is in the wrong place, IMHO, and should be in the loop below
    // However, a timeout of 4 seconds is OK for our purposes here, so I'm leaving it - PR
    slReturn gsiResp = getSpeedInfo( fdPort, &si );
    if( isErrorReturn( gsiResp ) )
        return makeErrorMsgReturn( ERR_CAUSE( gsiResp ), "problem getting speed information" );
    int maxMs = (int) max_ll( 4000, si.nsChar * 250 / 1000000 );

    int bauds[] = { 921600, 460800, 230400, 115200, 57600, 38400, 19200, 9600, 4800, 2400,
                    1800, 1200, 600, 300, 200, 150, 134, 110, 75, 50   };

    if( verbosity >= 3 ) printf( "Trying baud rates from 921600 to %d...\n", minBaud );

    for( int i = 0; (i < ARRAY_SIZE( bauds ) ) && (bauds[i] >= minBaud); i++ ) {

        if( verbosity >= 2 ) printf( "Trying %d baud...\n", bauds[i] );

        // set the baud rate for the current attempt...
        slReturn stobResp = setTermOptionsBaud( fdPort, bauds[i] );
        if( isErrorReturn( stobResp ) )
            return makeErrorFmtMsgReturn( ERR_CAUSE( stobResp ), "problem trying to set baud rate to %d", bauds[i] );

        // try to synchronize on it...
        slReturn syncResp = synchronizer( fdPort, maxMs, verbosity );
        if( isErrorReturn( syncResp ) )
            return makeErrorMsgReturn( ERR_CAUSE( syncResp ), "problem while synchronizing" );
        if( getReturnInfoBool( syncResp ) ) {
            if( verbosity >= 2 ) printf( "Synchronized on %d baud...\n", bauds[i] );
            return makeOkInfoReturn(int2info( bauds[i] ));
        }
    }
    printf( "Could not synchronize on any baud rate...\n" );
    return makeErrorFmtMsgReturn( ERR_ROOT, "could not synchronize at any baud rate from 921600 to %d", minBaud );
}